

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O0

void sfd_doread(nni_sfd_conn *c)

{
  nni_aio *pnVar1;
  nng_err result;
  ssize_t sVar2;
  int *piVar3;
  size_t count;
  undefined1 local_138 [8];
  iovec iovec [16];
  nni_iov *aiov;
  int local_28;
  uint naiov;
  int niov;
  int n;
  uint i;
  int fd;
  nni_aio *aio;
  nni_sfd_conn *c_local;
  
  n = c->fd;
  aio = (nni_aio *)c;
  if ((c->closed & 1U) == 0) {
    do {
      while( true ) {
        while( true ) {
          _i = (nni_aio *)nni_list_first((nni_list *)&(aio->a_task).task_cv);
          if (_i == (nni_aio *)0x0) {
            return;
          }
          nni_aio_get_iov(_i,(uint *)((long)&aiov + 4),(nni_iov **)&iovec[0xf].iov_len);
          if (aiov._4_4_ < 0x11) break;
          nni_aio_list_remove(_i);
          nni_aio_finish_error(_i,NNG_EINVAL);
        }
        local_28 = 0;
        for (niov = 0; (uint)niov < aiov._4_4_; niov = niov + 1) {
          if (*(long *)(iovec[0xf].iov_len + (ulong)(uint)niov * 0x10 + 8) != 0) {
            iovec[local_28].iov_base = *(void **)(iovec[0xf].iov_len + (ulong)(uint)niov * 0x10 + 8)
            ;
            iovec[(long)local_28 + -1].iov_len =
                 *(size_t *)(iovec[0xf].iov_len + (ulong)(uint)niov * 0x10);
            local_28 = local_28 + 1;
          }
        }
        sVar2 = readv(n,(iovec *)local_138,local_28);
        naiov = (uint)sVar2;
        if ((int)naiov < 0) break;
        if (naiov == 0) {
          nni_aio_list_remove(_i);
          nni_aio_finish_error(_i,NNG_ECONNSHUT);
        }
        else {
          nni_aio_bump_count(_i,(long)(int)naiov);
          nni_aio_list_remove(_i);
          pnVar1 = _i;
          count = nni_aio_count(_i);
          nni_aio_finish(pnVar1,NNG_OK,count);
        }
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (*piVar3 != 0xb) {
      nni_aio_list_remove(_i);
      pnVar1 = _i;
      piVar3 = __errno_location();
      result = nni_plat_errno(*piVar3);
      nni_aio_finish_error(pnVar1,result);
    }
  }
  return;
}

Assistant:

static void
sfd_doread(nni_sfd_conn *c)
{
	nni_aio *aio;
	int      fd = c->fd;

	if (c->closed) {
		return;
	}

	while ((aio = nni_list_first(&c->readq)) != NULL) {
		unsigned     i;
		int          n;
		int          niov;
		unsigned     naiov;
		nni_iov     *aiov;
		struct iovec iovec[16];

		nni_aio_get_iov(aio, &naiov, &aiov);
		if (naiov > NNI_NUM_ELEMENTS(iovec)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_EINVAL);
			continue;
		}
		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len != 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		if ((n = readv(fd, iovec, niov)) < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		if (n == 0) {
			// Zero indicates a closed descriptor.
			// This implicitly completes this (all!) aio.
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECONNSHUT);
			continue;
		}

		nni_aio_bump_count(aio, n);

		// We completed the entire operation on this aio.
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}